

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O2

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
::doSelection(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
              *this,Clause *c,uint eligible)

{
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
  *this_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  TermList TVar4;
  TermList TVar5;
  List<Kernel::Literal_*> *pLVar6;
  Literal *pLVar7;
  uint uVar8;
  uint uVar9;
  undefined8 *puVar10;
  Literal **ppLVar11;
  LiteralList *pLVar12;
  undefined8 uStack_c8;
  LiteralList *maximals;
  uint local_b4;
  CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>_>
  *local_b0;
  Set<Kernel::Literal_*,_Lib::DefaultHash> maxSet;
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
  local_80;
  
  puVar10 = &uStack_c8;
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::combSup == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::combSup), iVar3 != 0
     )) {
    doSelection::combSup = *(bool *)(Lib::env + 0xee42);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::combSup);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::litArr == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::litArr), iVar3 != 0)
     ) {
    Lib::DArray<Kernel::Literal_*>::DArray(&doSelection::litArr,0x40);
    __cxa_atexit(Lib::DArray<Kernel::Literal_*>::~DArray,&doSelection::litArr,&__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::litArr);
  }
  if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
       ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads == '\0') &&
     (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                   ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads),
     iVar3 != 0)) {
    Lib::Set<unsigned_int,_Lib::DefaultHash>::Set(&doSelection::maxTermHeads);
    __cxa_atexit(Lib::Set<unsigned_int,_Lib::DefaultHash>::~Set,&doSelection::maxTermHeads,
                 &__dso_handle);
    __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                         ::doSelection(Kernel::Clause*,unsigned_int)::maxTermHeads);
  }
  Lib::Set<unsigned_int,_Lib::DefaultHash>::reset(&doSelection::maxTermHeads);
  local_b4 = eligible;
  Lib::DArray<Kernel::Literal_*>::initFromArray<Kernel::Clause>
            (&doSelection::litArr,(ulong)eligible,c);
  local_b0 = this;
  LiteralComparators::
  Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::LexComparator>_>
  ::Composite(&local_80,&this->_comp);
  Lib::DArray<Kernel::Literal*>::
  sortInversed<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
            ((DArray<Kernel::Literal*> *)&doSelection::litArr,&local_80);
  maximals = (LiteralList *)0x0;
  if (doSelection::combSup == true) {
    fillMaximals(local_b0,&maximals,&doSelection::litArr);
    pLVar6 = maximals;
    while (pLVar6 != (LiteralList *)0x0) {
      pLVar6 = pLVar6->_tail;
      TVar4 = ApplicativeHelper::getHead((TermList)0x43f4d8);
      TVar5 = ApplicativeHelper::getHead((TermList)0x43f4e3);
      if ((TVar4._content & 1) != 0) {
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  (&doSelection::maxTermHeads,(uint)(TVar4._content >> 2));
      }
      if ((TVar5._content & 1) != 0) {
        Lib::Set<unsigned_int,_Lib::DefaultHash>::insert
                  (&doSelection::maxTermHeads,(uint)(TVar5._content >> 2));
      }
    }
  }
  this_00 = local_b0;
  bVar1 = LiteralSelector::isNegativeForSelection
                    (&local_b0->super_LiteralSelector,*doSelection::litArr._array);
  ppLVar11 = doSelection::litArr._array;
  if (!bVar1) {
    if (doSelection::combSup == false) {
      fillMaximals(this_00,&maximals,&doSelection::litArr);
    }
    pLVar12 = maximals;
    uVar2 = 1;
    do {
      uVar9 = uVar2;
      if ((pLVar12->_head == doSelection::litArr._array[uVar9 - 1]) &&
         (pLVar12 = pLVar12->_tail, pLVar12 == (LiteralList *)0x0)) goto LAB_0043f5cf;
      bVar1 = LiteralSelector::isNegativeForSelection
                        (&this_00->super_LiteralSelector,doSelection::litArr._array[uVar9]);
      uVar2 = uVar9 + 1;
    } while (!bVar1);
    ppLVar11 = doSelection::litArr._array + uVar9;
  }
  pLVar7 = *ppLVar11;
  if (pLVar7 == (Literal *)0x0) {
LAB_0043f5cf:
    uVar9 = local_b4;
    pLVar6 = maximals;
    uVar2 = local_b4;
    if ((maximals->_tail != (List<Kernel::Literal_*> *)0x0) ||
       (pLVar7 = maximals->_head, pLVar7 == (Literal *)0x0)) {
      for (; pLVar6 != (LiteralList *)0x0; pLVar6 = pLVar6->_tail) {
        uVar2 = uVar2 - 1;
      }
      if (uVar2 == 0) {
        Clause::setSelected(c,local_b4);
      }
      else {
        if ((CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
             ::doSelection(Kernel::Clause*,unsigned_int)::replaced == '\0') &&
           (iVar3 = __cxa_guard_acquire(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                                         ::doSelection(Kernel::Clause*,unsigned_int)::replaced),
           iVar3 != 0)) {
          Lib::Stack<Kernel::Literal_*>::Stack(&doSelection::replaced,0x10);
          __cxa_atexit(Lib::Stack<Kernel::Literal_*>::~Stack,&doSelection::replaced,&__dso_handle);
          __cxa_guard_release(&CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,Kernel::LiteralComparators::LexComparator>>>
                               ::doSelection(Kernel::Clause*,unsigned_int)::replaced);
        }
        Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::Set(&maxSet);
        while (puVar10 = (undefined8 *)puVar10[1], puVar10 != (undefined8 *)0x0) {
          Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::insert(&maxSet,(Literal *)*puVar10);
        }
        uVar2 = 0;
        while (maximals != (LiteralList *)0x0) {
          bVar1 = Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                            (&maxSet,c->_literals[(int)uVar2]);
          if (!bVar1) {
            Lib::Stack<Kernel::Literal_*>::push(&doSelection::replaced,c->_literals[(int)uVar2]);
          }
          pLVar7 = Lib::List<Kernel::Literal_*>::pop(&maximals);
          c->_literals[(int)uVar2] = pLVar7;
          uVar2 = uVar2 + 1;
        }
        uVar9 = uVar2;
        while (doSelection::replaced._cursor != doSelection::replaced._stack) {
          do {
            uVar8 = uVar9;
            bVar1 = Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::contains
                              (&maxSet,c->_literals[(int)uVar8]);
            uVar9 = uVar8 + 1;
          } while (!bVar1);
          ppLVar11 = doSelection::replaced._cursor + -1;
          doSelection::replaced._cursor = doSelection::replaced._cursor + -1;
          c->_literals[(int)uVar8] = *ppLVar11;
        }
        Clause::setSelected(c,uVar2);
        Lib::Set<Kernel::Literal_*,_Lib::DefaultHash>::~Set(&maxSet);
        uVar9 = local_b4;
      }
      goto LAB_0043f6e7;
    }
  }
  uVar2 = Clause::getLiteralPosition(c,pLVar7);
  if (uVar2 != 0) {
    pLVar7 = c->_literals[0];
    c->_literals[0] = c->_literals[(int)uVar2];
    c->_literals[(int)uVar2] = pLVar7;
  }
  Clause::setSelected(c,1);
  uVar9 = local_b4;
LAB_0043f6e7:
  Lib::List<Kernel::Literal_*>::destroy(maximals);
  LiteralSelector::ensureSomeColoredSelected(c,uVar9);
  return;
}

Assistant:

void doSelection(Clause* c, unsigned eligible) override
  {
    ASS_G(eligible, 1); //trivial cases should be taken care of by the base LiteralSelector

    static bool combSup = env.options->combinatorySup();

    static DArray<Literal*> litArr(64);
    static Set<unsigned> maxTermHeads;
    maxTermHeads.reset();
    litArr.initFromArray(eligible,*c);
    litArr.sortInversed(_comp);

    LiteralList* maximals=0;
    Literal* singleSelected=0; //If equals to 0 in the end, all maximal

    if(combSup){ 
      fillMaximals(maximals, litArr); 
      LiteralList::Iterator maxIt(maximals);
      while(maxIt.hasNext()){
        Literal* lit = maxIt.next();
        TermList t0 = *lit->nthArgument(0);
        TermList t1 = *lit->nthArgument(1);
        TermList h0 = ApplicativeHelper::getHead(t0);  
        TermList h1 = ApplicativeHelper::getHead(t1);
        if(h0.isVar()){ maxTermHeads.insert(h0.var()); }
        if(h1.isVar()){ maxTermHeads.insert(h1.var()); }
      }
    }
    //literals will be selected.
    bool allSelected=false;

    if(isNegativeForSelection(litArr[0])) {
      singleSelected=litArr[0];
    } else {
      if(!combSup){ fillMaximals(maximals, litArr); }
      unsigned besti=0;
      LiteralList* nextMax=maximals;
      while(true) {
        if(nextMax->head()==litArr[besti]) {
          nextMax=nextMax->tail();
          if(nextMax==0) {
            break;
          }
        }
        besti++;
        ASS_L(besti,eligible);
        if(isNegativeForSelection(litArr[besti])){
          singleSelected=litArr[besti];
          break;
        }
      }
    }
    if(!singleSelected && !maximals->tail()) {
      //there is only one maximal literal
      singleSelected=maximals->head();
    }
    if(!singleSelected) {
      unsigned selCnt=0;
      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        ASS(isPositiveForSelection(mit->head()));
        selCnt++;
      }
      if(selCnt==eligible) {
        allSelected=true;
      }
    }
    if(allSelected) {
      c->setSelected(eligible);
    } else if(!singleSelected) {
      //select multiple maximal literals
      static Stack<Literal*> replaced(16);
      Set<Literal*> maxSet;
      unsigned selCnt=0;

      for(LiteralList* mit=maximals; mit; mit=mit->tail()) {
        maxSet.insert(mit->head());
      }

      while(maximals) {
        if(!maxSet.contains((*c)[selCnt])) {
          replaced.push((*c)[selCnt]);
        }
        (*c)[selCnt]=LiteralList::pop(maximals);
        selCnt++;
      }
      ASS_G(selCnt,1);
      ASS_LE(selCnt,eligible);

      //put back non-selected literals that were removed
      unsigned i=selCnt;
      while(replaced.isNonEmpty()) {
        while(!maxSet.contains((*c)[i])) {
          i++;
          ASS_L(i,eligible);
        }
        (*c)[i++]=replaced.pop();
      }

      c->setSelected(selCnt);
    } else {
      unsigned besti=c->getLiteralPosition(singleSelected);
      if(besti!=0) {
        std::swap((*c)[0],(*c)[besti]);
      }
      c->setSelected(1);
    }
    LiteralList::destroy(maximals);

    ensureSomeColoredSelected(c, eligible);
  }